

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O1

PreprocessorOptions * __thiscall
slang::Bag::getOrDefault<slang::parsing::PreprocessorOptions>
          (PreprocessorOptions *__return_storage_ptr__,Bag *this)

{
  PreprocessorOptions *pPVar1;
  size_t sVar2;
  
  pPVar1 = get<slang::parsing::PreprocessorOptions>(this);
  if (pPVar1 == (PreprocessorOptions *)0x0) {
    memset(__return_storage_ptr__,0,0xa0);
    __return_storage_ptr__->maxIncludeDepth = 0x400;
    __return_storage_ptr__->languageVersion = Default;
    (__return_storage_ptr__->predefineSource)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->predefineSource).field_2;
    *(undefined4 *)&(__return_storage_ptr__->predefineSource).field_2 = 0x6970613c;
    *(undefined2 *)((long)&(__return_storage_ptr__->predefineSource).field_2 + 4) = 0x3e;
    (__return_storage_ptr__->predefineSource)._M_string_length = 5;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->additionalIncludePaths).
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->additionalIncludePaths).
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->additionalIncludePaths).
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->ignoreDirectives).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_size_index = 0x3f;
    (__return_storage_ptr__->ignoreDirectives).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_size_mask = 1;
    (__return_storage_ptr__->ignoreDirectives).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_ = (group_type_pointer)0x0;
    (__return_storage_ptr__->ignoreDirectives).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.elements_ = (value_type_pointer)0x0;
    (__return_storage_ptr__->ignoreDirectives).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_ =
         (group_type_pointer)
         &boost::unordered::detail::foa::
          dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
          ::storage;
    sVar2 = 0x1d;
    if ((__return_storage_ptr__->ignoreDirectives).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .arrays.elements_ == (value_type_pointer)0x0) {
      sVar2 = 0;
    }
    (__return_storage_ptr__->ignoreDirectives).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .size_ctrl.ml = sVar2;
    (__return_storage_ptr__->ignoreDirectives).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .size_ctrl.size = 0;
  }
  else {
    parsing::PreprocessorOptions::PreprocessorOptions(__return_storage_ptr__,pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T getOrDefault() const {
        const T* result = get<T>();
        if (result)
            return *result;
        return T();
    }